

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::CopyOpsBufferStorageTestCase::initTestCaseIteration
          (CopyOpsBufferStorageTestCase *this,GLuint sparse_bo)

{
  GLenum GVar1;
  
  this->m_sparse_bos[0] = sparse_bo;
  if ((this->m_test_cases).
      super__Vector_base<gl4cts::CopyOpsBufferStorageTestCase::_test_case,_std::allocator<gl4cts::CopyOpsBufferStorageTestCase::_test_case>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->m_test_cases).
      super__Vector_base<gl4cts::CopyOpsBufferStorageTestCase::_test_case,_std::allocator<gl4cts::CopyOpsBufferStorageTestCase::_test_case>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    initTestCases(this);
  }
  (*this->m_gl->bindBuffer)(0x8892,this->m_sparse_bos[0]);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x914);
  (*this->m_gl->bufferPageCommitmentARB)(0x8892,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x919);
  return true;
}

Assistant:

bool CopyOpsBufferStorageTestCase::initTestCaseIteration(glw::GLuint sparse_bo)
{
	bool result = true;

	/* Cache the BO id, if not cached already */
	DE_ASSERT(m_sparse_bos[0] == 0 || m_sparse_bos[0] == sparse_bo);

	m_sparse_bos[0] = sparse_bo;

	/* Initialize test cases, if this is the first call to initTestCaseIteration() */
	if (m_test_cases.size() == 0)
	{
		initTestCases();
	}

	/* Make sure all pages of the provided sparse BO are de-committed before
	 * ::execute() is called. */
	m_gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bos[0]);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0,				  /* offset */
								 m_sparse_bo_size_rounded, GL_FALSE); /* commit */

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

	return result;
}